

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_DisplayYUVOverlay(SDL12_Overlay *overlay12,SDL12_Rect *dstrect12)

{
  ushort uVar1;
  ushort uVar2;
  undefined8 *puVar3;
  unsigned_long uVar4;
  Uint32 UVar5;
  int iVar6;
  unsigned_long uVar7;
  QueuedOverlayItem *pQVar8;
  char *pcVar9;
  Uint8 *pUVar10;
  Uint8 *pUVar11;
  SDL_Rect local_30;
  
  uVar7 = (*SDL20_ThreadID)();
  uVar4 = SetVideoModeThread;
  if (overlay12 == (SDL12_Overlay *)0x0) {
    pcVar9 = "overlay";
LAB_0010d4f9:
    iVar6 = (*SDL20_SetError)("Parameter \'%s\' is invalid",pcVar9);
    return iVar6;
  }
  if (dstrect12 == (SDL12_Rect *)0x0) {
    pcVar9 = "dstrect";
    goto LAB_0010d4f9;
  }
  (*SDL20_LockMutex)(VideoRendererLock);
  if (VideoRenderer20 == (SDL_Renderer *)0x0) {
    iVar6 = (*SDL20_SetError)("No software screen surface available");
    return iVar6;
  }
  pQVar8 = &QueuedDisplayOverlays;
  do {
    pQVar8 = pQVar8->next;
    if (pQVar8 == (QueuedOverlayItem *)0x0) goto LAB_0010d533;
  } while (pQVar8->overlay12 != overlay12);
  if (uVar7 == uVar4) {
    if (VideoSurfaceUpdatedInBackgroundThread == '\x01') {
      SDL_Flip(VideoSurface12);
    }
    else if (VideoSurfacePresentTicks != 0) {
      PresentScreen();
    }
  }
LAB_0010d533:
  pQVar8 = (QueuedOverlayItem *)(*SDL20_malloc)(0x18);
  if (pQVar8 == (QueuedOverlayItem *)0x0) {
    UnlockVideoRenderer();
    iVar6 = (*SDL20_Error)(SDL_ENOMEM);
    return iVar6;
  }
  puVar3 = (undefined8 *)overlay12->hwdata;
  if (*(int *)(puVar3 + 1) == 0) goto LAB_0010d5f9;
  local_30.x = 0;
  local_30.y = 0;
  local_30.w = overlay12->w;
  local_30.h = overlay12->h;
  if (overlay12->format == 0x32315659) {
    pUVar10 = (Uint8 *)puVar3[5];
    uVar1 = *(ushort *)((long)puVar3 + 0x34);
    uVar2 = *(ushort *)((long)puVar3 + 0x32);
    pUVar11 = (Uint8 *)puVar3[4];
LAB_0010d5d5:
    (*SDL20_UpdateYUVTexture)
              ((SDL_Texture *)*puVar3,&local_30,(Uint8 *)puVar3[3],(uint)*(ushort *)(puVar3 + 6),
               pUVar10,(uint)uVar1,pUVar11,(uint)uVar2);
  }
  else {
    if (overlay12->format == 0x56555949) {
      uVar1 = *(ushort *)((long)puVar3 + 0x32);
      pUVar10 = (Uint8 *)puVar3[4];
      uVar2 = *(ushort *)((long)puVar3 + 0x34);
      pUVar11 = (Uint8 *)puVar3[5];
      goto LAB_0010d5d5;
    }
    (*SDL20_UpdateTexture)
              ((SDL_Texture *)*puVar3,&local_30,(Uint8 *)puVar3[3],(uint)*(ushort *)(puVar3 + 6));
  }
  if (overlay12->pixels == (Uint8 **)0x0) {
    *(undefined4 *)(puVar3 + 1) = 0;
  }
LAB_0010d5f9:
  pQVar8->overlay12 = overlay12;
  (*SDL20_memcpy)(&pQVar8->dstrect12,dstrect12,8);
  pQVar8->next = (QueuedOverlayItem *)0x0;
  QueuedDisplayOverlaysTail->next = pQVar8;
  UVar5 = VideoSurfaceLastPresentTicks;
  QueuedDisplayOverlaysTail = pQVar8;
  if (VideoSurfacePresentTicks == 0) {
    iVar6 = GetDesiredMillisecondsPerFrame();
    VideoSurfacePresentTicks = iVar6 + UVar5;
  }
  UnlockVideoRenderer();
  return 0;
}

Assistant:

SDLCALL
SDL_DisplayYUVOverlay(SDL12_Overlay *overlay12, SDL12_Rect *dstrect12)
{
    QueuedOverlayItem *overlay;
    SDL12_YUVData *hwdata;
    SDL_Renderer *renderer;
    const SDL_bool ThisIsSetVideoModeThread = (SDL20_ThreadID() == SetVideoModeThread) ? SDL_TRUE : SDL_FALSE;

    if (!overlay12) {
        return SDL20_InvalidParamError("overlay");
    }
    if (!dstrect12) {
        return SDL20_InvalidParamError("dstrect");
    }
    if ((renderer = LockVideoRenderer()) == NULL) {
        return SDL20_SetError("No software screen surface available");
    }

    for (overlay = QueuedDisplayOverlays.next; overlay != NULL; overlay = overlay->next) {
        if (overlay->overlay12 == overlay12) {   /* trying to draw the same overlay twice in one frame? Dump the current surface and overlays to the screen now. */
            /* Force an update of the screen. */
            if (ThisIsSetVideoModeThread) {
                if (VideoSurfaceUpdatedInBackgroundThread) {
                    SDL_Flip(VideoSurface12);  /* this will update the texture and present. */
                } else if (VideoSurfacePresentTicks) {
                    PresentScreen();
                }
            }

            break;
        }
    }

    if ((overlay = (QueuedOverlayItem *) SDL_malloc(sizeof (QueuedOverlayItem))) == NULL) {
        UnlockVideoRenderer();
        return SDL20_OutOfMemory();
    }

    hwdata = (SDL12_YUVData *) overlay12->hwdata;

    /* Upload contents if we've been locked, even if we're _still_ locked, to
       work around an SMPEG quirk. */
    if (hwdata->dirty) {
        SDL_Rect rect20;
        rect20.x = rect20.y = 0;
        rect20.w = overlay12->w;
        rect20.h = overlay12->h;
        if (overlay12->format == SDL12_IYUV_OVERLAY) {
            SDL20_UpdateYUVTexture(hwdata->texture20, &rect20,
                                 hwdata->pixels[0], hwdata->pitches[0],
                                 hwdata->pixels[1], hwdata->pitches[1],
                                 hwdata->pixels[2], hwdata->pitches[2]);
        } else if (overlay12->format == SDL12_YV12_OVERLAY) {
            SDL20_UpdateYUVTexture(hwdata->texture20, &rect20,
                                 hwdata->pixels[0], hwdata->pitches[0],
                                 hwdata->pixels[2], hwdata->pitches[2],
                                 hwdata->pixels[1], hwdata->pitches[1]);
        } else {
            SDL20_UpdateTexture(hwdata->texture20, &rect20, hwdata->pixels[0], hwdata->pitches[0]);
        }

        if (overlay12->pixels == NULL) {  /* must leave it marked as dirty if still locked! */
            hwdata->dirty = SDL_FALSE;
        }
    }

    /* The app may or may not SDL_Flip() after this...queue this to render on the next present,
       and start a timer going to force a present, in case they don't. */

    overlay->overlay12 = overlay12;
    SDL20_memcpy(&overlay->dstrect12, dstrect12, sizeof (SDL12_Rect));
    overlay->next = NULL;

    SDL_assert(QueuedDisplayOverlaysTail != NULL);
    SDL_assert(QueuedDisplayOverlaysTail->next == NULL);
    QueuedDisplayOverlaysTail->next = overlay;
    QueuedDisplayOverlaysTail = overlay;

    if (!VideoSurfacePresentTicks) {
        VideoSurfacePresentTicks = VideoSurfaceLastPresentTicks + GetDesiredMillisecondsPerFrame();  /* flip it later. */
    }

    UnlockVideoRenderer();

    return 0;
}